

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

int glslang::TIntermediate::getOffset(TType *type,int index)

{
  TType *parentType;
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int local_34;
  int local_30;
  int m;
  int offset;
  int memberSize;
  TTypeList *memberList;
  TType *pTStack_18;
  int index_local;
  TType *type_local;
  
  memberList._4_4_ = index;
  pTStack_18 = type;
  _offset = &TType::getStruct(type)->
             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
  pvVar3 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator[]
                     (_offset,(long)memberList._4_4_);
  iVar2 = (*pvVar3->type->_vptr_TType[10])();
  bVar1 = TQualifier::hasOffset((TQualifier *)CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    pvVar3 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator[]
                       (_offset,(long)memberList._4_4_);
    iVar2 = (*pvVar3->type->_vptr_TType[10])();
    type_local._4_4_ = *(int *)(CONCAT44(extraout_var_00,iVar2) + 0x14);
  }
  else {
    m = 0;
    local_30 = 0;
    for (local_34 = 0; parentType = pTStack_18, local_34 <= memberList._4_4_;
        local_34 = local_34 + 1) {
      pvVar3 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](_offset,(long)local_34);
      updateOffset(parentType,pvVar3->type,&local_30,&m);
      if (local_34 < memberList._4_4_) {
        local_30 = m + local_30;
      }
    }
    type_local._4_4_ = local_30;
  }
  return type_local._4_4_;
}

Assistant:

int TIntermediate::getOffset(const TType& type, int index)
{
    const TTypeList& memberList = *type.getStruct();

    // Don't calculate offset if one is present, it could be user supplied
    // and different than what would be calculated.  That is, this is faster,
    // but not just an optimization.
    if (memberList[index].type->getQualifier().hasOffset())
        return memberList[index].type->getQualifier().layoutOffset;

    int memberSize = 0;
    int offset = 0;
    for (int m = 0; m <= index; ++m) {
        updateOffset(type, *memberList[m].type, offset, memberSize);

        if (m < index)
            offset += memberSize;
    }

    return offset;
}